

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyLink.h
# Opt level: O1

void __thiscall btMultibodyLink::updateCacheMultiDof(btMultibodyLink *this,btScalar *pq)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  btScalar *pbVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float local_38;
  
  pbVar5 = this->m_jointPos;
  if (pq != (btScalar *)0x0) {
    pbVar5 = pq;
  }
  switch(this->m_jointType) {
  case eRevolute:
    fVar12 = *pbVar5;
    fVar6 = this->m_axes[0].m_topVec.m_floats[0];
    fVar7 = this->m_axes[0].m_topVec.m_floats[1];
    fVar9 = this->m_axes[0].m_topVec.m_floats[2];
    fVar6 = fVar9 * fVar9 + fVar6 * fVar6 + fVar7 * fVar7;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar7 = sinf(fVar12 * -0.5);
    fVar7 = fVar7 / fVar6;
    fVar15 = this->m_axes[0].m_topVec.m_floats[0] * fVar7;
    uVar1 = *(undefined8 *)(this->m_axes[0].m_topVec.m_floats + 1);
    fVar6 = fVar7 * (float)uVar1;
    fVar7 = fVar7 * (float)((ulong)uVar1 >> 0x20);
    fVar12 = cosf(fVar12 * -0.5);
    uVar1 = *(undefined8 *)(this->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    fVar9 = (float)uVar1;
    fVar8 = (float)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)((this->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2);
    fVar16 = (float)uVar1;
    fVar20 = (float)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)((this->m_dVector).m_floats + 1);
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0] =
         fVar8 * -fVar7 + fVar16 * fVar6 + fVar12 * fVar9 + fVar15 * fVar20;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1] =
         -fVar15 * fVar16 + fVar9 * fVar7 + fVar12 * fVar8 + fVar6 * fVar20;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2] =
         (fVar8 * fVar15 + fVar12 * fVar16 + fVar20 * fVar7) - fVar9 * fVar6;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3] =
         (fVar8 * -fVar6 + fVar12 * fVar20 + fVar9 * -fVar15) - fVar16 * fVar7;
    fVar12 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3];
    fVar6 = (this->m_eVector).m_floats[0];
    fVar7 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0];
    fVar9 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1];
    uVar3 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar20 = (float)uVar3;
    fVar22 = (float)((ulong)uVar3 >> 0x20);
    fVar8 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2];
    fVar24 = -fVar8;
    fVar10 = -fVar7;
    fVar15 = (fVar6 * fVar12 + fVar22 * fVar9) - fVar8 * fVar20;
    fVar16 = (fVar20 * fVar12 + fVar8 * fVar6) - fVar7 * fVar22;
    fVar21 = (fVar12 * fVar22 + fVar7 * fVar20) - fVar9 * fVar6;
    fVar20 = fVar22 * fVar24 + (fVar6 * fVar10 - fVar20 * fVar9);
    fVar6 = fVar9 * fVar21 + fVar16 * fVar24 + fVar10 * fVar20 + fVar12 * fVar15;
    fVar8 = fVar15 * fVar8 + fVar10 * fVar21 + -fVar9 * fVar20 + fVar16 * fVar12 + (float)uVar1;
    fVar12 = fVar16 * fVar7 + -fVar9 * fVar15 + fVar24 * fVar20 + fVar21 * fVar12 +
             (float)((ulong)uVar1 >> 0x20);
    goto LAB_001c14df;
  case ePrismatic:
    fVar12 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3];
    fVar6 = (this->m_eVector).m_floats[0];
    fVar7 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1];
    fVar9 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0];
    fVar15 = *pbVar5;
    uVar1 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar24 = (float)uVar1;
    fVar11 = (float)((ulong)uVar1 >> 0x20);
    fVar8 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2];
    fVar16 = -fVar8;
    fVar20 = -fVar9;
    fVar21 = (fVar6 * fVar12 + fVar11 * fVar7) - fVar8 * fVar24;
    fVar22 = (fVar24 * fVar12 + fVar8 * fVar6) - fVar9 * fVar11;
    fVar10 = (fVar12 * fVar11 + fVar9 * fVar24) - fVar7 * fVar6;
    fVar24 = fVar11 * fVar16 + (fVar6 * fVar20 - fVar24 * fVar7);
    fVar6 = fVar7 * fVar10 + fVar22 * fVar16 + fVar20 * fVar24 + fVar12 * fVar21 +
            (this->m_dVector).m_floats[0] + this->m_axes[0].m_bottomVec.m_floats[0] * fVar15;
    uVar1 = *(undefined8 *)((this->m_dVector).m_floats + 1);
    uVar3 = *(undefined8 *)(this->m_axes[0].m_bottomVec.m_floats + 1);
    fVar8 = fVar15 * (float)uVar3 +
            (float)uVar1 + fVar21 * fVar8 + fVar20 * fVar10 + -fVar7 * fVar24 + fVar22 * fVar12;
    fVar12 = fVar15 * (float)((ulong)uVar3 >> 0x20) +
             (float)((ulong)uVar1 >> 0x20) +
             fVar22 * fVar9 + -fVar7 * fVar21 + fVar16 * fVar24 + fVar10 * fVar12;
    break;
  case eSpherical:
    fVar12 = *pbVar5;
    fVar7 = -fVar12;
    uVar1 = *(undefined8 *)pbVar5;
    fVar9 = (float)*(undefined8 *)(pbVar5 + 1);
    fVar8 = (float)((ulong)*(undefined8 *)(pbVar5 + 1) >> 0x20);
    uVar3 = *(undefined8 *)(this->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    uVar2 = *(undefined8 *)((this->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2);
    fVar20 = (float)uVar2;
    fVar21 = (float)((ulong)uVar2 >> 0x20);
    fVar6 = pbVar5[3];
    fVar15 = (float)uVar3;
    fVar16 = (float)((ulong)uVar3 >> 0x20);
    uVar3 = *(undefined8 *)((this->m_dVector).m_floats + 1);
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0] =
         fVar16 * -fVar8 + fVar20 * fVar9 + ((float)uVar1 * fVar21 - fVar6 * fVar15);
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1] =
         fVar7 * fVar20 + fVar15 * fVar8 + ((float)((ulong)uVar1 >> 0x20) * fVar21 - fVar6 * fVar16)
    ;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2] =
         (fVar12 * fVar16 + (fVar8 * fVar21 - fVar6 * fVar20)) - fVar15 * fVar9;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3] =
         (-fVar9 * fVar16 + (fVar7 * fVar15 - fVar6 * fVar21)) - fVar20 * fVar8;
    fVar12 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3];
    fVar6 = (this->m_eVector).m_floats[0];
    fVar7 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0];
    fVar9 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1];
    uVar1 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar22 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    fVar8 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2];
    fVar20 = -fVar8;
    fVar21 = -fVar7;
    fVar15 = (fVar6 * fVar12 + fVar10 * fVar9) - fVar8 * fVar22;
    fVar16 = (fVar22 * fVar12 + fVar8 * fVar6) - fVar7 * fVar10;
    fVar24 = (fVar12 * fVar10 + fVar7 * fVar22) - fVar9 * fVar6;
    fVar22 = fVar10 * fVar20 + (fVar6 * fVar21 - fVar22 * fVar9);
    fVar6 = fVar9 * fVar24 + fVar16 * fVar20 + fVar21 * fVar22 + fVar12 * fVar15;
    fVar8 = fVar15 * fVar8 + fVar21 * fVar24 + -fVar9 * fVar22 + fVar16 * fVar12 + (float)uVar3;
    fVar12 = fVar16 * fVar7 + -fVar9 * fVar15 + fVar20 * fVar22 + fVar24 * fVar12 +
             (float)((ulong)uVar3 >> 0x20);
LAB_001c14df:
    fVar6 = fVar6 + (this->m_dVector).m_floats[0];
    break;
  case ePlanar:
    fVar12 = *pbVar5;
    fVar6 = this->m_axes[0].m_topVec.m_floats[0];
    fVar7 = this->m_axes[0].m_topVec.m_floats[1];
    fVar9 = this->m_axes[0].m_topVec.m_floats[2];
    fVar6 = fVar9 * fVar9 + fVar6 * fVar6 + fVar7 * fVar7;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar7 = sinf(fVar12 * -0.5);
    fVar7 = fVar7 / fVar6;
    fVar9 = this->m_axes[0].m_topVec.m_floats[0] * fVar7;
    uVar1 = *(undefined8 *)(this->m_axes[0].m_topVec.m_floats + 1);
    fVar6 = fVar7 * (float)uVar1;
    fVar7 = fVar7 * (float)((ulong)uVar1 >> 0x20);
    fVar12 = cosf(fVar12 * -0.5);
    uVar1 = *(undefined8 *)(this->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    fVar8 = (float)uVar1;
    fVar15 = (float)((ulong)uVar1 >> 0x20);
    uVar1 = *(undefined8 *)((this->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2);
    fVar16 = (float)uVar1;
    fVar20 = (float)((ulong)uVar1 >> 0x20);
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0] =
         fVar15 * -fVar7 + fVar16 * fVar6 + fVar12 * fVar8 + fVar9 * fVar20;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1] =
         -fVar9 * fVar16 + fVar8 * fVar7 + fVar12 * fVar15 + fVar6 * fVar20;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2] =
         (fVar15 * fVar9 + fVar12 * fVar16 + fVar20 * fVar7) - fVar8 * fVar6;
    (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3] =
         (fVar15 * -fVar6 + fVar12 * fVar20 + fVar8 * -fVar9) - fVar16 * fVar7;
    fVar12 = *pbVar5;
    fVar6 = this->m_axes[0].m_topVec.m_floats[0];
    fVar7 = this->m_axes[0].m_topVec.m_floats[1];
    fVar9 = this->m_axes[0].m_topVec.m_floats[2];
    fVar6 = fVar9 * fVar9 + fVar6 * fVar6 + fVar7 * fVar7;
    if (fVar6 < 0.0) {
      fVar6 = sqrtf(fVar6);
    }
    else {
      fVar6 = SQRT(fVar6);
    }
    fVar7 = sinf(fVar12 * -0.5);
    fVar7 = fVar7 / fVar6;
    fVar24 = this->m_axes[0].m_topVec.m_floats[1] * fVar7;
    uVar1 = *(undefined8 *)(this->m_axes[0].m_topVec.m_floats + 2);
    fVar6 = this->m_axes[0].m_topVec.m_floats[0];
    fVar20 = cosf(fVar12 * -0.5);
    fVar12 = (float)*(undefined8 *)(pbVar5 + 1);
    fVar9 = (float)((ulong)*(undefined8 *)(pbVar5 + 1) >> 0x20);
    fVar23 = this->m_axes[2].m_bottomVec.m_floats[0] * fVar9 +
             this->m_axes[1].m_bottomVec.m_floats[0] * fVar12;
    local_38 = (float)uVar1;
    local_38 = local_38 * fVar7;
    fVar6 = fVar6 * fVar7;
    uVar1 = *(undefined8 *)(this->m_axes[1].m_bottomVec.m_floats + 1);
    uVar3 = *(undefined8 *)(this->m_axes[2].m_bottomVec.m_floats + 1);
    fVar8 = fVar9 * (float)uVar3 + fVar12 * (float)uVar1;
    fVar17 = fVar9 * (float)((ulong)uVar3 >> 0x20) + fVar12 * (float)((ulong)uVar1 >> 0x20);
    fVar10 = -local_38;
    fVar13 = -fVar6;
    fVar18 = (fVar23 * fVar20 + fVar24 * fVar17) - local_38 * fVar8;
    fVar19 = (fVar8 * fVar20 + local_38 * fVar23) - fVar6 * fVar17;
    uVar1 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar7 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1];
    fVar12 = (this->m_eVector).m_floats[0];
    fVar9 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2];
    fVar25 = (float)uVar1;
    fVar26 = (float)((ulong)uVar1 >> 0x20);
    fVar15 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3];
    fVar16 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0];
    fVar11 = (fVar12 * fVar15 + fVar26 * fVar7) - fVar9 * fVar25;
    fVar14 = (fVar25 * fVar15 + fVar9 * fVar12) - fVar16 * fVar26;
    fVar27 = -fVar9;
    fVar28 = -fVar16;
    fVar21 = (fVar20 * fVar17 + fVar8 * fVar6) - fVar24 * fVar23;
    fVar22 = (fVar15 * fVar26 + fVar16 * fVar25) - fVar7 * fVar12;
    fVar17 = fVar17 * fVar10 + (fVar23 * fVar13 - fVar8 * fVar24);
    fVar23 = fVar26 * fVar27 + (fVar12 * fVar28 - fVar25 * fVar7);
    fVar8 = fVar11 * fVar9 + fVar28 * fVar22 + -fVar7 * fVar23 + fVar14 * fVar15 +
            local_38 * fVar18 + fVar13 * fVar21 + -fVar24 * fVar17 + fVar20 * fVar19;
    fVar12 = fVar14 * fVar16 + -fVar7 * fVar11 + fVar27 * fVar23 + fVar22 * fVar15 +
             fVar6 * fVar19 + -fVar24 * fVar18 + fVar10 * fVar17 + fVar20 * fVar21;
    fVar6 = fVar7 * fVar22 + fVar14 * fVar27 + fVar28 * fVar23 + fVar11 * fVar15 +
            fVar24 * fVar21 + fVar19 * fVar10 + fVar13 * fVar17 + fVar18 * fVar20;
    break;
  case eFixed:
    uVar1 = *(undefined8 *)((this->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2);
    *(undefined8 *)(this->m_cachedRotParentToThis).super_btQuadWord.m_floats =
         *(undefined8 *)(this->m_zeroRotParentToThis).super_btQuadWord.m_floats;
    *(undefined8 *)((this->m_cachedRotParentToThis).super_btQuadWord.m_floats + 2) = uVar1;
    fVar12 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[3];
    fVar6 = (this->m_eVector).m_floats[0];
    fVar7 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[0];
    fVar9 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[1];
    uVar1 = *(undefined8 *)((this->m_eVector).m_floats + 1);
    fVar22 = (float)uVar1;
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    fVar8 = (this->m_cachedRotParentToThis).super_btQuadWord.m_floats[2];
    fVar15 = -fVar8;
    fVar16 = -fVar7;
    fVar20 = (fVar6 * fVar12 + fVar10 * fVar9) - fVar8 * fVar22;
    fVar21 = (fVar22 * fVar12 + fVar8 * fVar6) - fVar7 * fVar10;
    fVar24 = (fVar12 * fVar10 + fVar7 * fVar22) - fVar9 * fVar6;
    fVar22 = fVar10 * fVar15 + (fVar6 * fVar16 - fVar22 * fVar9);
    fVar6 = fVar9 * fVar24 + fVar21 * fVar15 + fVar16 * fVar22 + fVar12 * fVar20 +
            (this->m_dVector).m_floats[0];
    uVar1 = *(undefined8 *)((this->m_dVector).m_floats + 1);
    fVar8 = (float)uVar1 + fVar20 * fVar8 + fVar16 * fVar24 + -fVar9 * fVar22 + fVar21 * fVar12;
    fVar12 = (float)((ulong)uVar1 >> 0x20) +
             fVar21 * fVar7 + -fVar9 * fVar20 + fVar15 * fVar22 + fVar24 * fVar12;
    break;
  default:
    goto switchD_001c08ce_default;
  }
  auVar4._4_4_ = fVar8;
  auVar4._0_4_ = fVar6;
  auVar4._8_4_ = fVar12;
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_cachedRVector).m_floats = auVar4;
switchD_001c08ce_default:
  return;
}

Assistant:

void updateCacheMultiDof(btScalar *pq = 0)
	{
		btScalar *pJointPos = (pq ? pq : &m_jointPos[0]);

		switch(m_jointType)
		{
			case eRevolute:
			{
				m_cachedRotParentToThis = btQuaternion(getAxisTop(0),-pJointPos[0]) * m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			case ePrismatic:
			{
				// m_cachedRotParentToThis never changes, so no need to update
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector) + pJointPos[0] * getAxisBottom(0);

				break;
			}
			case eSpherical:
			{
				m_cachedRotParentToThis = btQuaternion(pJointPos[0], pJointPos[1], pJointPos[2], -pJointPos[3]) * m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			case ePlanar:
			{
				m_cachedRotParentToThis = btQuaternion(getAxisTop(0),-pJointPos[0]) * m_zeroRotParentToThis;				
				m_cachedRVector = quatRotate(btQuaternion(getAxisTop(0),-pJointPos[0]), pJointPos[1] * getAxisBottom(1) + pJointPos[2] * getAxisBottom(2)) + quatRotate(m_cachedRotParentToThis,m_eVector);				

				break;
			}
			case eFixed:
			{
				m_cachedRotParentToThis = m_zeroRotParentToThis;
				m_cachedRVector = m_dVector + quatRotate(m_cachedRotParentToThis,m_eVector);

				break;
			}
			default:
			{
				//invalid type
				btAssert(0);
			}
		}
	}